

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parseUser_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  bool bVar1;
  element_type *peVar2;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  undefined1 local_35;
  allocator local_21;
  __shared_ptr_access<TgBot::User,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  Ptr *object_local;
  TgTypeParser *this_local;
  string *result;
  
  local_20 = (__shared_ptr_access<TgBot::User,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)object;
  object_local = (Ptr *)this;
  this_local = (TgTypeParser *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)object);
  if (bVar1) {
    local_35 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'{');
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"id",&local_59);
    peVar2 = std::__shared_ptr_access<TgBot::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,&peVar2->id);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"is_bot",&local_81);
    peVar2 = std::__shared_ptr_access<TgBot::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_80,&peVar2->isBot);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,"first_name",&local_a9);
    peVar2 = std::__shared_ptr_access<TgBot::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_a8,&peVar2->firstName);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"last_name",&local_d1);
    peVar2 = std::__shared_ptr_access<TgBot::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_d0,&peVar2->lastName);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"username",&local_f9);
    peVar2 = std::__shared_ptr_access<TgBot::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_f8,&peVar2->username);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"language_code",&local_121);
    peVar2 = std::__shared_ptr_access<TgBot::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_120,&peVar2->languageCode);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'}');
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseUser(const User::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "id", object->id);
    appendToJson(result, "is_bot", object->isBot);
    appendToJson(result, "first_name", object->firstName);
    appendToJson(result, "last_name", object->lastName);
    appendToJson(result, "username", object->username);
    appendToJson(result, "language_code", object->languageCode);
    removeLastComma(result);
    result += '}';
    return result;
}